

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O3

void __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::createTextures
          (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this)

{
  unsigned_short uVar1;
  GLenum GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  deUint32 dVar14;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar60;
  undefined1 auVar58 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  allocator_type local_49;
  vector<unsigned_short,_std::allocator<unsigned_short>_> inputData;
  long lVar15;
  
  iVar13 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar13);
  (**(code **)(lVar15 + 0x6f8))(1,&this->m_input_to_id);
  dVar14 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar14,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x107);
  (**(code **)(lVar15 + 0xb8))((this->m_test_configuration).m_target,this->m_input_to_id);
  dVar14 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar14,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x10b);
  iVar13 = (this->m_test_configuration).m_n_in_components;
  GVar2 = (this->m_test_configuration).m_target;
  iVar19 = (this->m_test_configuration).m_height * (this->m_test_configuration).m_width *
           (this->m_test_configuration).m_depth;
  if ((GVar2 == 0x8c1a) || (GVar2 == 0x806f)) {
    (**(code **)(lVar15 + 0x1398))(GVar2,1,(this->m_test_configuration).m_input_internal_format);
    dVar14 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar14,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x146);
    if ((this->m_test_configuration).m_input_internal_format != 0x9278) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&inputData,(long)(iVar19 * iVar13),&local_49);
      auVar12 = _DAT_019ec5b0;
      GVar4 = (this->m_test_configuration).m_width;
      GVar5 = (this->m_test_configuration).m_height;
      GVar3 = (this->m_test_configuration).m_depth;
      uVar16 = GVar5 * GVar4 * GVar3 * (this->m_test_configuration).m_n_in_components;
      if (uVar16 != 0) {
        uVar1 = (this->m_test_configuration).m_init_value;
        lVar17 = (ulong)uVar16 - 1;
        auVar39._8_4_ = (int)lVar17;
        auVar39._0_8_ = lVar17;
        auVar39._12_4_ = (int)((ulong)lVar17 >> 0x20);
        uVar18 = 0;
        auVar39 = auVar39 ^ _DAT_019ec5b0;
        auVar34 = _DAT_01a918f0;
        auVar63 = _DAT_01a91900;
        auVar67 = _DAT_01a1c6c0;
        auVar38 = _DAT_019f34d0;
        do {
          auVar51 = auVar38 ^ auVar12;
          iVar13 = auVar39._0_4_;
          iVar54 = -(uint)(iVar13 < auVar51._0_4_);
          iVar19 = auVar39._4_4_;
          auVar26._4_4_ = -(uint)(iVar19 < auVar51._4_4_);
          iVar60 = auVar39._8_4_;
          iVar59 = -(uint)(iVar60 < auVar51._8_4_);
          iVar21 = auVar39._12_4_;
          auVar26._12_4_ = -(uint)(iVar21 < auVar51._12_4_);
          auVar46._4_4_ = iVar54;
          auVar46._0_4_ = iVar54;
          auVar46._8_4_ = iVar59;
          auVar46._12_4_ = iVar59;
          auVar61 = pshuflw(in_XMM11,auVar46,0xe8);
          auVar28._4_4_ = -(uint)(auVar51._4_4_ == iVar19);
          auVar28._12_4_ = -(uint)(auVar51._12_4_ == iVar21);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar66 = pshuflw(in_XMM12,auVar28,0xe8);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          auVar62 = pshuflw(auVar61,auVar26,0xe8);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar62 | auVar66 & auVar61) ^ auVar51;
          auVar51 = packssdw(auVar51,auVar51);
          if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18] = uVar1;
          }
          auVar26 = auVar28 & auVar46 | auVar26;
          auVar51 = packssdw(auVar26,auVar26);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar62,auVar51 ^ auVar62);
          if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 1] = uVar1;
          }
          auVar51 = auVar67 ^ auVar12;
          iVar54 = -(uint)(iVar13 < auVar51._0_4_);
          auVar55._4_4_ = -(uint)(iVar19 < auVar51._4_4_);
          iVar59 = -(uint)(iVar60 < auVar51._8_4_);
          auVar55._12_4_ = -(uint)(iVar21 < auVar51._12_4_);
          auVar27._4_4_ = iVar54;
          auVar27._0_4_ = iVar54;
          auVar27._8_4_ = iVar59;
          auVar27._12_4_ = iVar59;
          auVar45._4_4_ = -(uint)(auVar51._4_4_ == iVar19);
          auVar45._12_4_ = -(uint)(auVar51._12_4_ == iVar21);
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar51 = auVar45 & auVar27 | auVar55;
          auVar51 = packssdw(auVar51,auVar51);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar10,auVar51 ^ auVar10);
          if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 2] = uVar1;
          }
          auVar28 = pshufhw(auVar27,auVar27,0x84);
          auVar46 = pshufhw(auVar45,auVar45,0x84);
          auVar26 = pshufhw(auVar28,auVar55,0x84);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar26 | auVar46 & auVar28) ^ auVar29;
          auVar28 = packssdw(auVar29,auVar29);
          if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 3] = uVar1;
          }
          auVar28 = auVar63 ^ auVar12;
          iVar54 = -(uint)(iVar13 < auVar28._0_4_);
          auVar31._4_4_ = -(uint)(iVar19 < auVar28._4_4_);
          iVar59 = -(uint)(iVar60 < auVar28._8_4_);
          auVar31._12_4_ = -(uint)(iVar21 < auVar28._12_4_);
          auVar47._4_4_ = iVar54;
          auVar47._0_4_ = iVar54;
          auVar47._8_4_ = iVar59;
          auVar47._12_4_ = iVar59;
          auVar51 = pshuflw(auVar51,auVar47,0xe8);
          auVar30._4_4_ = -(uint)(auVar28._4_4_ == iVar19);
          auVar30._12_4_ = -(uint)(auVar28._12_4_ == iVar21);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          in_XMM12 = pshuflw(auVar66 & auVar61,auVar30,0xe8);
          in_XMM12 = in_XMM12 & auVar51;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar51 = pshuflw(auVar51,auVar31,0xe8);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar51 | in_XMM12) ^ auVar61;
          auVar51 = packssdw(auVar61,auVar61);
          if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 4] = uVar1;
          }
          auVar31 = auVar30 & auVar47 | auVar31;
          auVar51 = packssdw(auVar31,auVar31);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar51 = packssdw(auVar51 ^ auVar66,auVar51 ^ auVar66);
          if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 5] = uVar1;
          }
          auVar51 = auVar34 ^ auVar12;
          iVar13 = -(uint)(iVar13 < auVar51._0_4_);
          auVar56._4_4_ = -(uint)(iVar19 < auVar51._4_4_);
          iVar60 = -(uint)(iVar60 < auVar51._8_4_);
          auVar56._12_4_ = -(uint)(iVar21 < auVar51._12_4_);
          auVar32._4_4_ = iVar13;
          auVar32._0_4_ = iVar13;
          auVar32._8_4_ = iVar60;
          auVar32._12_4_ = iVar60;
          auVar48._4_4_ = -(uint)(auVar51._4_4_ == iVar19);
          auVar48._12_4_ = -(uint)(auVar51._12_4_ == iVar21);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar51 = auVar48 & auVar32 | auVar56;
          auVar51 = packssdw(auVar51,auVar51);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar51 ^ auVar11,auVar51 ^ auVar11);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 6] = uVar1;
          }
          auVar51 = pshufhw(auVar32,auVar32,0x84);
          auVar26 = pshufhw(auVar48,auVar48,0x84);
          auVar28 = pshufhw(auVar51,auVar56,0x84);
          auVar33._8_4_ = 0xffffffff;
          auVar33._0_8_ = 0xffffffffffffffff;
          auVar33._12_4_ = 0xffffffff;
          auVar33 = (auVar28 | auVar26 & auVar51) ^ auVar33;
          auVar51 = packssdw(auVar33,auVar33);
          if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 7] = uVar1;
          }
          uVar18 = uVar18 + 8;
          lVar17 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 8;
          auVar38._8_8_ = lVar17 + 8;
          lVar17 = auVar67._8_8_;
          auVar67._0_8_ = auVar67._0_8_ + 8;
          auVar67._8_8_ = lVar17 + 8;
          lVar17 = auVar63._8_8_;
          auVar63._0_8_ = auVar63._0_8_ + 8;
          auVar63._8_8_ = lVar17 + 8;
          lVar17 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 8;
          auVar34._8_8_ = lVar17 + 8;
        } while (((ulong)uVar16 + 7 & 0xfffffffffffffff8) != uVar18);
      }
      (**(code **)(lVar15 + 0x13c0))
                ((this->m_test_configuration).m_target,0,0,0,0,GVar4,GVar5,GVar3,
                 (this->m_test_configuration).m_input_format,
                 (this->m_test_configuration).m_input_type,
                 inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      dVar14 = (**(code **)(lVar15 + 0x800))();
      glu::checkError(dVar14,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x167);
      goto LAB_00cd311b;
    }
    (**(code **)(lVar15 + 0x2b0))
              ((this->m_test_configuration).m_target,0,0,0,0,(this->m_test_configuration).m_width,
               (this->m_test_configuration).m_height,(this->m_test_configuration).m_depth,0x9278,
               0x6000,"");
    dVar14 = (**(code **)(lVar15 + 0x800))();
    iVar13 = 0x155;
  }
  else {
    if (GVar2 != 0xde1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D!"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x16d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar15 + 0x1380))(0xde1,1,(this->m_test_configuration).m_input_internal_format);
    dVar14 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar14,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x11c);
    if ((this->m_test_configuration).m_input_internal_format != 0x9278) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&inputData,(long)(iVar19 * iVar13),&local_49);
      auVar12 = _DAT_019ec5b0;
      GVar4 = (this->m_test_configuration).m_width;
      GVar5 = (this->m_test_configuration).m_height;
      uVar16 = GVar5 * GVar4 * (this->m_test_configuration).m_depth *
               (this->m_test_configuration).m_n_in_components;
      if (uVar16 != 0) {
        uVar1 = (this->m_test_configuration).m_init_value;
        lVar17 = (ulong)uVar16 - 1;
        auVar20._8_4_ = (int)lVar17;
        auVar20._0_8_ = lVar17;
        auVar20._12_4_ = (int)((ulong)lVar17 >> 0x20);
        uVar18 = 0;
        auVar20 = auVar20 ^ _DAT_019ec5b0;
        auVar22 = _DAT_01a918f0;
        auVar23 = _DAT_01a91900;
        auVar24 = _DAT_01a1c6c0;
        auVar25 = _DAT_019f34d0;
        do {
          auVar34 = auVar25 ^ auVar12;
          iVar13 = auVar20._0_4_;
          iVar54 = -(uint)(iVar13 < auVar34._0_4_);
          iVar19 = auVar20._4_4_;
          auVar36._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
          iVar60 = auVar20._8_4_;
          iVar59 = -(uint)(iVar60 < auVar34._8_4_);
          iVar21 = auVar20._12_4_;
          auVar36._12_4_ = -(uint)(iVar21 < auVar34._12_4_);
          auVar49._4_4_ = iVar54;
          auVar49._0_4_ = iVar54;
          auVar49._8_4_ = iVar59;
          auVar49._12_4_ = iVar59;
          auVar63 = pshuflw(in_XMM11,auVar49,0xe8);
          auVar35._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
          auVar35._12_4_ = -(uint)(auVar34._12_4_ == iVar21);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar67 = pshuflw(in_XMM12,auVar35,0xe8);
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar34 = pshuflw(auVar63,auVar36,0xe8);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar34 | auVar67 & auVar63) ^ auVar64;
          auVar34 = packssdw(auVar64,auVar64);
          if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18] = uVar1;
          }
          auVar36 = auVar35 & auVar49 | auVar36;
          auVar34 = packssdw(auVar36,auVar36);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar34 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
          if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 1] = uVar1;
          }
          auVar34 = auVar24 ^ auVar12;
          iVar54 = -(uint)(iVar13 < auVar34._0_4_);
          auVar57._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
          iVar59 = -(uint)(iVar60 < auVar34._8_4_);
          auVar57._12_4_ = -(uint)(iVar21 < auVar34._12_4_);
          auVar37._4_4_ = iVar54;
          auVar37._0_4_ = iVar54;
          auVar37._8_4_ = iVar59;
          auVar37._12_4_ = iVar59;
          auVar50._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
          auVar50._12_4_ = -(uint)(auVar34._12_4_ == iVar21);
          auVar50._0_4_ = auVar50._4_4_;
          auVar50._8_4_ = auVar50._12_4_;
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar34 = auVar50 & auVar37 | auVar57;
          auVar34 = packssdw(auVar34,auVar34);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar34 = packssdw(auVar34 ^ auVar7,auVar34 ^ auVar7);
          if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 2] = uVar1;
          }
          auVar38 = pshufhw(auVar37,auVar37,0x84);
          auVar51 = pshufhw(auVar50,auVar50,0x84);
          auVar39 = pshufhw(auVar38,auVar57,0x84);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar39 | auVar51 & auVar38) ^ auVar40;
          auVar38 = packssdw(auVar40,auVar40);
          if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 3] = uVar1;
          }
          auVar38 = auVar23 ^ auVar12;
          iVar54 = -(uint)(iVar13 < auVar38._0_4_);
          auVar42._4_4_ = -(uint)(iVar19 < auVar38._4_4_);
          iVar59 = -(uint)(iVar60 < auVar38._8_4_);
          auVar42._12_4_ = -(uint)(iVar21 < auVar38._12_4_);
          auVar52._4_4_ = iVar54;
          auVar52._0_4_ = iVar54;
          auVar52._8_4_ = iVar59;
          auVar52._12_4_ = iVar59;
          auVar34 = pshuflw(auVar34,auVar52,0xe8);
          auVar41._4_4_ = -(uint)(auVar38._4_4_ == iVar19);
          auVar41._12_4_ = -(uint)(auVar38._12_4_ == iVar21);
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          in_XMM12 = pshuflw(auVar67 & auVar63,auVar41,0xe8);
          in_XMM12 = in_XMM12 & auVar34;
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar34 = pshuflw(auVar34,auVar42,0xe8);
          auVar65._8_4_ = 0xffffffff;
          auVar65._0_8_ = 0xffffffffffffffff;
          auVar65._12_4_ = 0xffffffff;
          auVar65 = (auVar34 | in_XMM12) ^ auVar65;
          auVar34 = packssdw(auVar65,auVar65);
          if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 4] = uVar1;
          }
          auVar42 = auVar41 & auVar52 | auVar42;
          auVar34 = packssdw(auVar42,auVar42);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
          if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 5] = uVar1;
          }
          auVar34 = auVar22 ^ auVar12;
          iVar13 = -(uint)(iVar13 < auVar34._0_4_);
          auVar58._4_4_ = -(uint)(iVar19 < auVar34._4_4_);
          iVar60 = -(uint)(iVar60 < auVar34._8_4_);
          auVar58._12_4_ = -(uint)(iVar21 < auVar34._12_4_);
          auVar43._4_4_ = iVar13;
          auVar43._0_4_ = iVar13;
          auVar43._8_4_ = iVar60;
          auVar43._12_4_ = iVar60;
          auVar53._4_4_ = -(uint)(auVar34._4_4_ == iVar19);
          auVar53._12_4_ = -(uint)(auVar34._12_4_ == iVar21);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          auVar34 = auVar53 & auVar43 | auVar58;
          auVar34 = packssdw(auVar34,auVar34);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar34 ^ auVar9,auVar34 ^ auVar9);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 6] = uVar1;
          }
          auVar34 = pshufhw(auVar43,auVar43,0x84);
          auVar67 = pshufhw(auVar53,auVar53,0x84);
          auVar63 = pshufhw(auVar34,auVar58,0x84);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar63 | auVar67 & auVar34) ^ auVar44;
          auVar34 = packssdw(auVar44,auVar44);
          if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18 + 7] = uVar1;
          }
          uVar18 = uVar18 + 8;
          lVar17 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 8;
          auVar25._8_8_ = lVar17 + 8;
          lVar17 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 8;
          auVar24._8_8_ = lVar17 + 8;
          lVar17 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 8;
          auVar23._8_8_ = lVar17 + 8;
          lVar17 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 8;
          auVar22._8_8_ = lVar17 + 8;
        } while (((ulong)uVar16 + 7 & 0xfffffffffffffff8) != uVar18);
      }
      (**(code **)(lVar15 + 0x13b8))
                ((this->m_test_configuration).m_target,0,0,0,GVar4,GVar5,
                 (this->m_test_configuration).m_input_format,
                 (this->m_test_configuration).m_input_type,
                 inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      dVar14 = (**(code **)(lVar15 + 0x800))();
      glu::checkError(dVar14,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x139);
LAB_00cd311b:
      if (inputData.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(inputData.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)inputData.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)inputData.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00cd3132;
    }
    (**(code **)(lVar15 + 0x2a8))
              ((this->m_test_configuration).m_target,0,0,0,(this->m_test_configuration).m_width,
               (this->m_test_configuration).m_height,0x9278,0x1000,"");
    dVar14 = (**(code **)(lVar15 + 0x800))();
    iVar13 = 0x129;
  }
  glu::checkError(dVar14,"Error filling texture with compressed data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,iVar13);
LAB_00cd3132:
  (**(code **)(lVar15 + 0x6f8))(1,&this->m_output_to_id);
  dVar14 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar14,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x173);
  (**(code **)(lVar15 + 0xb8))(0xde1,this->m_output_to_id);
  dVar14 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar14,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x177);
  (**(code **)(lVar15 + 0x1380))
            (0xde1,1,(this->m_test_configuration).m_output_internal_format,
             (this->m_test_configuration).m_width,(this->m_test_configuration).m_height);
  dVar14 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar14,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x17c);
  return;
}

Assistant:

void TextureBorderClampSamplingTexture<InputType, OutputType>::createTextures(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate input texture */
	gl.genTextures(1, &m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind input texture */
	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	glw::GLsizei components = m_test_configuration.get_n_in_components();
	glw::GLsizei texelsNumber =
		m_test_configuration.get_width() * m_test_configuration.get_height() * m_test_configuration.get_depth();

	/* Allocate storage for input texture and fill it with data */
	{
		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		{
			gl.texStorage2D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat */
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height());				  /* height */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage2D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D),				 /* image size */
										   compressed_image_data_2D);						 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage2D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
		{
			gl.texStorage3D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat*/
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height(),				  /* height */
							m_test_configuration.get_depth());				  /* depth */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage3D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   0,												 /* zoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_depth(),				 /* depth */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D_array),			 /* image size */
										   compressed_image_data_2D_array);					 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage3D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 0,										  /* zoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_depth(),		  /* depth */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		default:
			TCU_FAIL("Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, "
					 "GL_TEXTURE_3D!");
		}
	}

	/* Generate output texture */
	gl.genTextures(1, &m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind output texture */
	gl.bindTexture(GL_TEXTURE_2D, m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* Allocate storage for output texture */
	gl.texStorage2D(GL_TEXTURE_2D, 1, m_test_configuration.get_output_internal_format(),
					m_test_configuration.get_width(), m_test_configuration.get_height());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");
}